

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O2

void RegisterOutputScriptRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff58;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterOutputScriptRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"util",(allocator<char> *)&stack0xffffffffffffff5f);
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands,in_stack_ffffffffffffff58,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"util",(allocator<char> *)&stack0xffffffffffffff5e);
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 1,in_stack_ffffffffffffff58,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"util",(allocator<char> *)&stack0xffffffffffffff5d);
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 2,in_stack_ffffffffffffff58,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffff60,"util",
                 (allocator<char> *)&stack0xffffffffffffff5c);
      CRPCCommand::CRPCCommand
                (RegisterOutputScriptRPCCommands::commands + 3,in_stack_ffffffffffffff58,
                 (RpcMethodFnType)&stack0xffffffffffffff60);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterOutputScriptRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterOutputScriptRPCCommands::commands;
  for (lVar2 = 0x200; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterOutputScriptRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"util", &validateaddress},
        {"util", &createmultisig},
        {"util", &deriveaddresses},
        {"util", &getdescriptorinfo},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}